

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::DtlsSession::Send
          (Error *__return_storage_ptr__,DtlsSession *this,ByteArray *aBuf,MessageSubType aSubType)

{
  char cVar1;
  char *from;
  char *to;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  MessageSubType aSubType_local;
  writer write;
  undefined1 local_c8 [8];
  string local_c0;
  parse_func local_a0 [1];
  string local_98;
  undefined1 local_78 [8];
  string local_70;
  undefined1 local_50 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  aSubType_local = aSubType;
  if (this->mState == kConnected) {
    if ((this->mSendQueue).c.
        super__Deque_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        (this->mSendQueue).c.
        super__Deque_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      std::
      deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>
      ::
      emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>const&,ot::commissioner::MessageSubType&>
                ((deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>
                  *)&this->mSendQueue,aBuf,&aSubType_local);
      return __return_storage_ptr__;
    }
    Write((Error *)local_c8,this,aBuf,aSubType);
    Error::operator=(__return_storage_ptr__,(Error *)local_c8);
    std::__cxx11::string::~string((string *)(local_c8 + 8));
    if (__return_storage_ptr__->mCode == kNone) {
      return __return_storage_ptr__;
    }
    Error::Error((Error *)local_78,__return_storage_ptr__);
    if (((uint)local_78._0_4_ < kAlreadyExists) &&
       ((0x1201U >> (local_78._0_4_ & (kRejected|kInvalidState)) & 1) != 0)) {
      std::__cxx11::string::~string((string *)(local_78 + 8));
      std::
      deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>
      ::
      emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>const&,ot::commissioner::MessageSubType&>
                ((deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>
                  *)&this->mSendQueue,aBuf,&aSubType_local);
      this_00 = (string *)(local_c8 + 8);
      local_c8._0_4_ = none_type;
      local_c0._M_dataplus._M_p = local_c8 + 0x18;
      local_c0._M_string_length = 0;
      local_c0.field_2._M_allocated_capacity =
           local_c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      Error::operator=(__return_storage_ptr__,(Error *)local_c8);
    }
    else {
      this_00 = (string *)(local_78 + 8);
    }
  }
  else {
    local_c8._0_4_ = none_type;
    local_c0._M_dataplus._M_p = "the DTLS session is not connected";
    local_c0._M_string_length = 0x21;
    local_c0.field_2._M_allocated_capacity = 0;
    local_a0[0] = (parse_func)0x0;
    from = "the DTLS session is not connected";
    write.handler_ = (format_string_checker<char> *)local_c8;
    local_c0.field_2._8_8_ = (format_string_checker<char> *)local_c8;
    while (from != "") {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,from,"");
          goto LAB_0018f2e3;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",(format_string_checker<char> *)local_c8);
    }
LAB_0018f2e3:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_c8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_98,(v10 *)"the DTLS session is not connected",(string_view)ZEXT816(0x21),args)
    ;
    local_50._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_50 + 8),(string *)&local_98);
    Error::operator=(__return_storage_ptr__,(Error *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 8));
    this_00 = &local_98;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Send(const ByteArray &aBuf, MessageSubType aSubType)
{
    Error error;

    VerifyOrExit(mState == State::kConnected, error = ERROR_INVALID_STATE("the DTLS session is not connected"));

    if (mSendQueue.empty())
    {
        error = Write(aBuf, aSubType);
        if (error != ErrorCode::kNone && !ShouldStop(error))
        {
            mSendQueue.emplace(aBuf, aSubType);

            // hide non-critical error (IO Busy) from caller.
            error = ERROR_NONE;
        }
    }
    else
    {
        mSendQueue.emplace(aBuf, aSubType);
    }

exit:
    return error;
}